

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::clear
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this)

{
  CSkinPart *pCVar1;
  CSkinPart *in_RDI;
  int in_stack_00000024;
  
  allocator_default<CSkins::CSkinPart>::free_array(in_RDI);
  in_RDI->m_aName[4] = '\x01';
  in_RDI->m_aName[5] = '\0';
  in_RDI->m_aName[6] = '\0';
  in_RDI->m_aName[7] = '\0';
  pCVar1 = allocator_default<CSkins::CSkinPart>::alloc_array(in_stack_00000024);
  *(CSkinPart **)in_RDI = pCVar1;
  in_RDI->m_aName[8] = '\0';
  in_RDI->m_aName[9] = '\0';
  in_RDI->m_aName[10] = '\0';
  in_RDI->m_aName[0xb] = '\0';
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}